

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O2

void __thiscall
QAbstractItemModelTesterPrivate::columnsInserted
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int first,int last)

{
  QObject *pQVar1;
  bool bVar2;
  int t;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a0;
  ChangeInFlight local_88 [6];
  char *local_70;
  QDebug local_68;
  undefined1 local_60 [48];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_88[0] = ColumnsInserted;
  bVar2 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,local_88,"changeInFlight",
                     "ChangeInFlight::ColumnsInserted",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x2e7);
  if (bVar2) {
    this->changeInFlight = None;
    lcModelTest();
    if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_88[0] = ColumnsMoved;
      local_88[1] = None;
      local_88[2] = None;
      local_88[3] = None;
      local_88[4] = None;
      local_88[5] = 0;
      local_70 = lcModelTest::category.name;
      QMessageLogger::debug();
      pQVar3 = QDebug::operator<<(&local_68,"columnsInserted");
      pQVar3 = QDebug::operator<<(pQVar3,"start=");
      pQVar3 = QDebug::operator<<(pQVar3,first);
      pQVar3 = QDebug::operator<<(pQVar3,"end=");
      pQVar3 = QDebug::operator<<(pQVar3,last);
      pQVar3 = QDebug::operator<<(pQVar3,"parent=");
      local_60._0_8_ = pQVar3->stream;
      *(int *)(local_60._0_8_ + 0x28) = *(int *)(local_60._0_8_ + 0x28) + 1;
      operator<<((Stream *)(local_60 + 8),(QModelIndex *)local_60);
      pQVar3 = QDebug::operator<<((QDebug *)(local_60 + 8),"parent data=");
      pQVar1 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar1 + 0x90))(local_60 + 0x10,pQVar1,parent,0);
      QVariant::toString();
      pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_a0);
      pQVar3 = QDebug::operator<<(pQVar3,"current count of parent=");
      pQVar1 = (this->model).wp.value;
      t = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
      QDebug::operator<<(pQVar3,t);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
      QVariant::~QVariant((QVariant *)(local_60 + 0x10));
      QDebug::~QDebug((QDebug *)(local_60 + 8));
      QDebug::~QDebug((QDebug *)local_60);
      QDebug::~QDebug(&local_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::columnsInserted(const QModelIndex &parent, int first,
                                                      int last)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::ColumnsInserted);
    changeInFlight = ChangeInFlight::None;

    qCDebug(lcModelTest) << "columnsInserted"
                         << "start=" << first << "end=" << last << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent);
}